

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Common.cpp
# Opt level: O1

bool __thiscall psy::C::Parser::parseTypeName(Parser *this,TypeNameSyntax **typeName)

{
  bool bVar1;
  bool bVar2;
  TypeNameSyntax *pTVar3;
  SpecifierListSyntax *specList;
  DeclarationSyntax *decl;
  SpecifierListSyntax *local_28;
  DeclarationSyntax *local_20;
  
  bVar2 = false;
  local_20 = (DeclarationSyntax *)0x0;
  local_28 = (SpecifierListSyntax *)0x0;
  bVar1 = parseSpecifierQualifierList(this,&local_20,&local_28);
  if (bVar1) {
    pTVar3 = makeNode<psy::C::TypeNameSyntax>(this);
    *typeName = pTVar3;
    pTVar3->specs_ = local_28;
    bVar2 = parseAbstractDeclarator(this,&(*typeName)->decltor_);
  }
  return bVar2;
}

Assistant:

bool Parser::parseTypeName(TypeNameSyntax*& typeName)
{
    DBG_THIS_RULE();

    DeclarationSyntax* decl = nullptr;
    SpecifierListSyntax* specList = nullptr;
    if (!parseSpecifierQualifierList(decl, specList))
        return false;

    typeName = makeNode<TypeNameSyntax>();
    typeName->specs_ = specList;
    return parseAbstractDeclarator(typeName->decltor_);
}